

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O3

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
SearchBase::findLinkToSubtoken
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          SearchBase *this,string *htmlPage,string_view subtoken,string *capsulationBegin,
          string *capsulationEnd)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  size_type __pos;
  size_type sVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  string_view strv;
  string tokenWithCapsulationbegin;
  string_view link;
  long local_78;
  long lStack_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  long local_58 [2];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  SearchBase *local_38;
  
  local_68._M_len = (size_t)local_58;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,subtoken._M_str,subtoken._M_str + subtoken._M_len);
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_68,0,(char *)0x0,
                              (ulong)(capsulationBegin->_M_dataplus)._M_p);
  plVar7 = &local_78;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_78 = *plVar6;
    lStack_70 = plVar3[3];
  }
  else {
    local_78 = *plVar6;
    plVar7 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((long *)local_68._M_len != local_58) {
    operator_delete((void *)local_68._M_len,local_58[0] + 1);
  }
  for (__pos = std::__cxx11::string::find((char *)htmlPage,(ulong)plVar7,0);
      __pos != 0xffffffffffffffff;
      __pos = std::__cxx11::string::find((char *)htmlPage,(ulong)plVar7,__pos + lVar1)) {
    lVar5 = capsulationBegin->_M_string_length + __pos;
    local_68._M_len = htmlPage->_M_string_length - lVar5;
    local_68._M_str = (htmlPage->_M_dataplus)._M_p + lVar5;
    plVar3 = (long *)std::basic_string_view<char,_std::char_traits<char>_>::find
                               (&local_68,(capsulationEnd->_M_dataplus)._M_p,0,
                                capsulationEnd->_M_string_length);
    if (plVar3 == (long *)0xffffffffffffffff) break;
    strv._M_str = local_68._M_str;
    strv._M_len = (size_t)plVar3;
    local_68._M_len = (size_t)plVar3;
    bVar2 = isSubtoken(local_38,strv,subtoken);
    if (bVar2) {
      local_48._M_str = (htmlPage->_M_dataplus)._M_p;
      local_48._M_len = htmlPage->_M_string_length;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                        (&local_48,"<a href=\"",__pos,9);
      if (sVar4 == 0xffffffffffffffff) {
        bVar2 = false;
      }
      else {
        local_48._M_str = local_48._M_str + sVar4 + 9;
        local_48._M_len = local_48._M_len - (sVar4 + 9);
        bVar2 = false;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_48,"\"",0,1);
        if (sVar4 != 0xffffffffffffffff) {
          (__return_storage_ptr__->
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_len = sVar4;
          (__return_storage_ptr__->
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_str = local_48._M_str;
          bVar2 = true;
          local_48._M_len = sVar4;
        }
      }
      (__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = bVar2;
      goto LAB_001534ff;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = false;
LAB_001534ff:
  if (plVar7 != &local_78) {
    operator_delete(plVar7,local_78 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> findLinkToSubtoken(const std::string& htmlPage, std::string_view subtoken, const std::string& capsulationBegin, const std::string& capsulationEnd) const {
		const std::string_view link_token_begin = "<a href=\"";
		const std::string_view link_token_end = "\"";

		const std::string tokenWithCapsulationbegin = capsulationBegin + std::string(subtoken);

		size_t capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin);
		while (capsulationBegin_pos != std::string::npos) {
			std::string_view token_element = std::string_view(htmlPage);
			token_element.remove_prefix(capsulationBegin_pos + capsulationBegin.length());

			const size_t capsulationEnd_pos = token_element.find(capsulationEnd);
			if (capsulationEnd_pos == std::string::npos) {
				return {};
			}
			token_element.remove_suffix(token_element.length() - capsulationEnd_pos);

			if (isSubtoken(token_element, subtoken)) {
				std::string_view link = std::string_view(htmlPage);
				const size_t link_token_begin_pos = link.rfind(link_token_begin, capsulationBegin_pos);
				if (link_token_begin_pos == std::string::npos) {
					return {};
				}
				link.remove_prefix(link_token_begin_pos + link_token_begin.length());


				const size_t link_token_end_pos = link.find(link_token_end);
				if (link_token_end_pos == std::string::npos) {
					return {};
				}
				link.remove_suffix(link.length() - link_token_end_pos);

				return link;
			}

			capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin, capsulationBegin_pos + tokenWithCapsulationbegin.length());
		}
		return {};
	}